

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void __thiscall tinyxml2::XMLElement::DeleteAttribute(XMLElement *this,char *name)

{
  XMLAttribute *pXVar1;
  MemPool *pMVar2;
  char *pcVar3;
  XMLAttribute **ppXVar4;
  XMLAttribute *pXVar5;
  long lVar6;
  char cVar7;
  XMLAttribute *pXVar8;
  
  pXVar8 = this->_rootAttribute;
  if (pXVar8 == (XMLAttribute *)0x0) {
    return;
  }
  pcVar3 = StrPair::GetStr(&pXVar8->_name);
  if (pcVar3 == name) {
    pXVar5 = (XMLAttribute *)0x0;
  }
  else {
    pXVar5 = (XMLAttribute *)0x0;
    do {
      cVar7 = *name;
      if (cVar7 != '\0') {
        lVar6 = 0;
        do {
          if ((cVar7 != pcVar3[lVar6]) || ((int)lVar6 == 0x7fffffff)) {
            if ((int)lVar6 != 0x7fffffff) goto LAB_001b1665;
            goto LAB_001b1699;
          }
          cVar7 = name[lVar6 + 1];
          lVar6 = lVar6 + 1;
        } while (cVar7 != '\0');
        if ((int)lVar6 == 0x7fffffff) break;
        pcVar3 = pcVar3 + lVar6;
      }
      if (*pcVar3 == '\0') break;
LAB_001b1665:
      pXVar1 = pXVar8->_next;
      if (pXVar1 == (XMLAttribute *)0x0) {
        return;
      }
      pcVar3 = StrPair::GetStr(&pXVar1->_name);
      pXVar5 = pXVar8;
      pXVar8 = pXVar1;
    } while (pcVar3 != name);
  }
LAB_001b1699:
  ppXVar4 = &pXVar5->_next;
  if (pXVar5 == (XMLAttribute *)0x0) {
    ppXVar4 = &this->_rootAttribute;
  }
  *ppXVar4 = pXVar8->_next;
  pMVar2 = pXVar8->_memPool;
  (**pXVar8->_vptr_XMLAttribute)(pXVar8);
  (*pMVar2->_vptr_MemPool[4])(pMVar2,pXVar8);
  return;
}

Assistant:

void XMLElement::DeleteAttribute( const char* name )
{
    XMLAttribute* prev = 0;
    for( XMLAttribute* a=_rootAttribute; a; a=a->_next ) {
        if ( XMLUtil::StringEqual( name, a->Name() ) ) {
            if ( prev ) {
                prev->_next = a->_next;
            }
            else {
                _rootAttribute = a->_next;
            }
            DeleteAttribute( a );
            break;
        }
        prev = a;
    }
}